

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::
GenerateDynamicMethodNewBuildMessageInfo(ImmutableMessageLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  int iVar1;
  uint32 uVar2;
  JavaType JVar3;
  OneofGeneratorInfo *args_1;
  ImmutableFieldLiteGenerator *pIVar4;
  Descriptor *pDVar5;
  ulong extraout_RDX;
  int i_4;
  int i;
  int iVar6;
  long lVar7;
  uint32 uVar8;
  long lVar9;
  int i_1;
  java *this_01;
  int i_2;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  sorted_fields;
  vector<unsigned_short,_std::allocator<unsigned_short>_> chars;
  string line;
  FieldDescriptor *local_38;
  
  io::Printer::Indent(printer);
  chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar5 = (this->super_MessageGenerator).descriptor_;
  bVar12 = *(int *)(*(long *)(pDVar5 + 0x10) + 0x3c) != 3;
  uVar8 = bVar12 + 2;
  if (*(char *)(*(long *)(pDVar5 + 0x20) + 0x48) == '\0') {
    uVar8 = (uint32)bVar12;
  }
  WriteUInt32ToUtf16CharSequence(uVar8,&chars);
  WriteUInt32ToUtf16CharSequence
            (*(uint32 *)((this->super_MessageGenerator).descriptor_ + 0x68),&chars);
  if (*(int *)((this->super_MessageGenerator).descriptor_ + 0x68) == 0) {
    io::Printer::Print<>(printer,"java.lang.Object[] objects = null;");
  }
  else {
    io::Printer::Print<>(printer,"java.lang.Object[] objects = new java.lang.Object[] {\n");
    io::Printer::Indent(printer);
    WriteUInt32ToUtf16CharSequence
              (*(uint32 *)((this->super_MessageGenerator).descriptor_ + 0x6c),&chars);
    lVar10 = 0;
    for (lVar7 = 0; pDVar5 = (this->super_MessageGenerator).descriptor_,
        lVar7 < *(int *)(pDVar5 + 0x6c); lVar7 = lVar7 + 1) {
      args_1 = Context::GetOneofGeneratorInfo
                         (this->context_,(OneofDescriptor *)(*(long *)(pDVar5 + 0x30) + lVar10));
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,"\"$oneof_name$_\",\n\"$oneof_name$Case_\",\n",(char (*) [11])0x3a0b80,
                 &args_1->name);
      lVar10 = lVar10 + 0x30;
    }
    lVar10 = 0;
    iVar6 = 0;
    for (lVar7 = 0; lVar7 < *(int *)(pDVar5 + 0x68); lVar7 = lVar7 + 1) {
      pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar5 + 0x28) + lVar10));
      iVar1 = (*pIVar4->_vptr_ImmutableFieldLiteGenerator[2])(pIVar4);
      iVar6 = iVar6 + iVar1;
      pDVar5 = (this->super_MessageGenerator).descriptor_;
      lVar10 = lVar10 + 0x98;
    }
    uVar2 = (iVar6 + 0x1f) / 0x20;
    uVar11 = (long)(iVar6 + 0x1f) % 0x20 & 0xffffffff;
    this_01 = (java *)0x0;
    uVar8 = uVar2;
    if ((int)uVar2 < 1) {
      uVar8 = 0;
    }
    for (; uVar8 != (uint32)this_01; this_01 = (java *)(ulong)((uint32)this_01 + 1)) {
      GetBitFieldName_abi_cxx11_(&line,this_01,(int)uVar11);
      io::Printer::Print<char[15],std::__cxx11::string>
                (printer,"\"$bit_field_name$\",\n",(char (*) [15])"bit_field_name",&line);
      std::__cxx11::string::~string((string *)&line);
      uVar11 = extraout_RDX;
    }
    WriteUInt32ToUtf16CharSequence(uVar2,&chars);
    sorted_fields._M_t.
    super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl =
         (__uniq_ptr_data<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>,_true,_true>
          )SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
    uVar2 = 0;
    uVar8 = 0;
    for (lVar7 = 0; lVar7 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x68);
        lVar7 = lVar7 + 1) {
      this_00 = *(FieldDescriptor **)
                 ((long)sorted_fields._M_t.
                        super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                        .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                        _M_head_impl + lVar7 * 8);
      bVar12 = FieldDescriptor::is_map(this_00);
      if (bVar12) {
        uVar2 = uVar2 + 1;
      }
      else {
        uVar8 = uVar8 + (*(int *)(this_00 + 0x3c) == 3);
      }
    }
    WriteUInt32ToUtf16CharSequence
              (*(uint32 *)
                (*(long *)sorted_fields._M_t.
                          super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                          .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                          _M_head_impl + 0x44),&chars);
    WriteUInt32ToUtf16CharSequence
              (*(uint32 *)
                (*(long *)((long)sorted_fields._M_t.
                                 super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                 .
                                 super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>
                                 ._M_head_impl + -8 +
                          (long)*(int *)((this->super_MessageGenerator).descriptor_ + 0x68) * 8) +
                0x44),&chars);
    WriteUInt32ToUtf16CharSequence
              (*(uint32 *)((this->super_MessageGenerator).descriptor_ + 0x68),&chars);
    WriteUInt32ToUtf16CharSequence(uVar2,&chars);
    WriteUInt32ToUtf16CharSequence(uVar8,&chars);
    line.field_2._M_allocated_capacity = 0;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length = 0;
    lVar10 = 0;
    for (lVar7 = 0; pDVar5 = (this->super_MessageGenerator).descriptor_,
        lVar7 < *(int *)(pDVar5 + 0x68); lVar7 = lVar7 + 1) {
      lVar9 = *(long *)(pDVar5 + 0x28);
      if (*(int *)(lVar9 + 0x3c + lVar10) == 2) {
LAB_002dbaa0:
        local_38 = (FieldDescriptor *)(lVar9 + lVar10);
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::emplace_back<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)&line,&local_38);
      }
      else {
        JVar3 = GetJavaType((FieldDescriptor *)(lVar9 + lVar10));
        if (JVar3 == JAVATYPE_MESSAGE) {
          pDVar5 = FieldDescriptor::message_type
                             ((FieldDescriptor *)
                              (*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) + lVar10
                              ));
          bVar12 = HasRequiredFields(pDVar5);
          if (bVar12) {
            lVar9 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x28);
            goto LAB_002dbaa0;
          }
        }
      }
      lVar10 = lVar10 + 0x98;
    }
    WriteUInt32ToUtf16CharSequence
              ((uint32)(line._M_string_length - (long)line._M_dataplus._M_p >> 3),&chars);
    for (lVar7 = 0; lVar7 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x68);
        lVar7 = lVar7 + 1) {
      pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (&this->field_generators_,
                          *(FieldDescriptor **)
                           ((long)sorted_fields._M_t.
                                  super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                  .
                                  super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>
                                  ._M_head_impl + lVar7 * 8));
      (*pIVar4->_vptr_ImmutableFieldLiteGenerator[7])(pIVar4,printer,&chars);
    }
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"};\n");
    std::
    _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~_Vector_base((_Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)&line);
    std::
    unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ::~unique_ptr(&sorted_fields);
  }
  io::Printer::Print<>(printer,"java.lang.String info =\n");
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_allocated_capacity = line.field_2._M_allocated_capacity & 0xffffffffffffff00;
  for (uVar11 = 0;
      uVar11 < (ulong)((long)chars.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)chars.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 1); uVar11 = uVar11 + 1) {
    EscapeUtf16ToString(chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar11],&line);
    if (0x4f < line._M_string_length) {
      io::Printer::Print<char[7],std::__cxx11::string>
                (printer,"    \"$string$\" +\n",(char (*) [7])0x3ddc9b,&line);
      line._M_string_length = 0;
      *line._M_dataplus._M_p = '\0';
    }
  }
  io::Printer::Print<char[7],std::__cxx11::string>
            (printer,"    \"$string$\";\n",(char (*) [7])0x3ddc9b,&line);
  io::Printer::Print<>(printer,"return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  io::Printer::Outdent(printer);
  std::__cxx11::string::~string((string *)&line);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodNewBuildMessageInfo(
    io::Printer* printer) {
  printer->Indent();

  // Collect field info into a sequence of UTF-16 chars. It will be embedded
  // as a Java string in the generated code.
  std::vector<uint16> chars;

  int flags = 0;
  if (SupportFieldPresence(descriptor_->file())) {
    flags |= 0x1;
  }
  if (descriptor_->options().message_set_wire_format()) {
    flags |= 0x2;
  }
  WriteIntToUtf16CharSequence(flags, &chars);
  WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);

  if (descriptor_->field_count() == 0) {
    printer->Print("java.lang.Object[] objects = null;");
  } else {
    // A single array of all fields (including oneof, oneofCase, hasBits).
    printer->Print("java.lang.Object[] objects = new java.lang.Object[] {\n");
    printer->Indent();

    // Record the number of oneofs.
    WriteIntToUtf16CharSequence(descriptor_->oneof_decl_count(), &chars);
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
      const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
      printer->Print(
          "\"$oneof_name$_\",\n"
          "\"$oneof_name$Case_\",\n",
          "oneof_name", context_->GetOneofGeneratorInfo(oneof)->name);
    }

    // Integers for bit fields.
    int total_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      total_bits +=
          field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
    }
    int total_ints = (total_bits + 31) / 32;
    for (int i = 0; i < total_ints; i++) {
      printer->Print("\"$bit_field_name$\",\n", "bit_field_name",
                     GetBitFieldName(i));
    }
    WriteIntToUtf16CharSequence(total_ints, &chars);

    int map_count = 0;
    int repeated_count = 0;
    std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
        SortFieldsByNumber(descriptor_));
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      if (field->is_map()) {
        map_count++;
      } else if (field->is_repeated()) {
        repeated_count++;
      }
    }

    WriteIntToUtf16CharSequence(sorted_fields[0]->number(), &chars);
    WriteIntToUtf16CharSequence(
        sorted_fields[descriptor_->field_count() - 1]->number(), &chars);
    WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);
    WriteIntToUtf16CharSequence(map_count, &chars);
    WriteIntToUtf16CharSequence(repeated_count, &chars);

    std::vector<const FieldDescriptor*> fields_for_is_initialized_check;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (descriptor_->field(i)->is_required() ||
          (GetJavaType(descriptor_->field(i)) == JAVATYPE_MESSAGE &&
           HasRequiredFields(descriptor_->field(i)->message_type()))) {
        fields_for_is_initialized_check.push_back(descriptor_->field(i));
      }
    }
    WriteIntToUtf16CharSequence(fields_for_is_initialized_check.size(), &chars);

    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      field_generators_.get(field).GenerateFieldInfo(printer, &chars);
    }
    printer->Outdent();
    printer->Print("};\n");
  }

  printer->Print("java.lang.String info =\n");
  std::string line;
  for (size_t i = 0; i < chars.size(); i++) {
    uint16 code = chars[i];
    EscapeUtf16ToString(code, &line);
    if (line.size() >= 80) {
      printer->Print("    \"$string$\" +\n", "string", line);
      line.clear();
    }
  }
  printer->Print("    \"$string$\";\n", "string", line);

  printer->Print("return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  printer->Outdent();
}